

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Elf.cpp
# Opt level: O3

void * elf::Open(char *filename)

{
  FILE *__stream;
  size_t __size;
  void *__ptr;
  size_t sVar1;
  
  if (filename == (char *)0x0) {
    return (void *)0x0;
  }
  __stream = fopen(filename,"r");
  if (__stream != (FILE *)0x0) {
    fseeko(__stream,0,2);
    __size = ftello(__stream);
    rewind(__stream);
    if (__size != 0) {
      __ptr = malloc(__size);
      sVar1 = fread(__ptr,1,__size,__stream);
      fclose(__stream);
      if (sVar1 != __size) {
        return (void *)0x0;
      }
      return __ptr;
    }
    fclose(__stream);
  }
  return (void *)0x0;
}

Assistant:

void* elf::Open(const char* filename) {
    if(filename == NULL)
        return NULL;

    FILE* fp = fopen(filename, "r");

    if(!fp) {
        return NULL;
    }

    fseeko(fp, 0, SEEK_END);
    off_t elf_len = ftello(fp);
    rewind(fp);

    if(elf_len == 0) {
        fclose(fp);
        return NULL;
    }

    void* elf_data = malloc((size_t) elf_len);

    if(fread(elf_data, 1, (size_t) elf_len, fp) != elf_len) {
        fclose(fp);
        return NULL;
    }

    fclose(fp);

    return elf_data;
}